

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::TexturePool::compact(TexturePool *this)

{
  bool bVar1;
  reference puVar2;
  iterator iStack_28;
  uint id;
  iterator __end2;
  iterator __begin2;
  TexturePool *__range2;
  TexturePool *this_local;
  
  glFlush();
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  iStack_28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    glBindTexture(0xde1,*puVar2);
    glTexImage2D(0xde1,0,0x1908,0,0,0,0x1908,0x1401,0);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void compact() {
            glFlush();
            for (auto id : *this) {
                glBindTexture(GL_TEXTURE_2D, id);
                glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
            }
        }